

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump_kconfig.cpp
# Opt level: O0

bool anon_unknown.dwarf_6f3d8::class_or_subclass_have_properties(MetaClass *top)

{
  bool bVar1;
  size_type sVar2;
  reference psVar3;
  element_type *top_00;
  undefined1 local_40 [8];
  shared_ptr<MetaClass> child;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_> *__range1;
  MetaClass *top_local;
  
  if (top == (MetaClass *)0x0) {
    top_local._7_1_ = 0;
  }
  else {
    sVar2 = std::
            vector<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>::
            size(&top->properties);
    if (sVar2 == 0) {
      __end1 = std::vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>
               ::begin(&top->subclasses);
      child.super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>::
           end(&top->subclasses);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<std::shared_ptr<MetaClass>_*,_std::vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>_>
                                         *)&child.
                                            super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount), bVar1) {
        psVar3 = __gnu_cxx::
                 __normal_iterator<std::shared_ptr<MetaClass>_*,_std::vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>_>
                 ::operator*(&__end1);
        std::shared_ptr<MetaClass>::shared_ptr((shared_ptr<MetaClass> *)local_40,psVar3);
        top_00 = std::__shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>::get
                           ((__shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2> *)local_40);
        bVar1 = class_or_subclass_have_properties(top_00);
        if (bVar1) {
          top_local._7_1_ = 1;
        }
        std::shared_ptr<MetaClass>::~shared_ptr((shared_ptr<MetaClass> *)local_40);
        if (bVar1) goto LAB_001186fb;
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<MetaClass>_*,_std::vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>_>
        ::operator++(&__end1);
      }
      top_local._7_1_ = 0;
    }
    else {
      top_local._7_1_ = 1;
    }
  }
LAB_001186fb:
  return (bool)(top_local._7_1_ & 1);
}

Assistant:

bool class_or_subclass_have_properties(MetaClass *top) {
  if (!top)
    return false;
  if (top->properties.size() != 0) {
    return true;
  }

  for (auto child : top->subclasses) {
    if (class_or_subclass_have_properties(child.get())) {
      return true;
    }
  }
  return false;
}